

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

longdouble * trng::math::detail::mln1p<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  int n;
  int iVar1;
  longdouble *plVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  
  if ((longdouble)0.03125 <= ABS(x)) {
    plVar2 = (longdouble *)log1pl();
  }
  else {
    lVar6 = (longdouble)0;
    plVar2 = (longdouble *)0x2;
    lVar5 = (longdouble)1;
    lVar3 = x;
    while( true ) {
      lVar3 = lVar3 * x;
      iVar1 = (int)plVar2;
      if ((iVar1 == 0x40) ||
         (lVar4 = (lVar5 * lVar3) / (longdouble)iVar1, lVar6 = lVar6 + lVar4,
         ABS(lVar4) < lVar6 * (longdouble)4.3368087e-19)) break;
      lVar5 = -lVar5;
      plVar2 = (longdouble *)(ulong)(iVar1 + 1);
    }
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }